

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

void StringFormatter<int,_int>::format(ostream *os,char *fmt)

{
  runtime_error *this;
  char *local_20;
  char *p;
  char *fmt_local;
  ostream *os_local;
  
  local_20 = fmt;
  while( true ) {
    while( true ) {
      if (*local_20 == '\0') {
        return;
      }
      if (*local_20 == '%') break;
      std::operator<<(os,*local_20);
      local_20 = local_20 + 1;
    }
    if (local_20[1] != '%') break;
    std::operator<<(os,local_20[1]);
    local_20 = local_20 + 2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"not enough arguments to format");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void format(std::ostream&os, const char *fmt) 
    {
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {
                    throw std::runtime_error("not enough arguments to format");
                }
            }
            else {
                os << *p++;
            }
        }
    }